

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O2

void Abc_NamStop(Abc_Nam_t *p)

{
  char *__ptr;
  
  __ptr = (p->vBuffer).pArray;
  if (__ptr != (char *)0x0) {
    free(__ptr);
    (p->vBuffer).pArray = (char *)0x0;
  }
  (p->vBuffer).nCap = 0;
  (p->vBuffer).nSize = 0;
  Vec_IntErase(&p->vInt2Handle);
  Vec_IntErase(&p->vInt2Next);
  if (p->pStore != (char *)0x0) {
    free(p->pStore);
    p->pStore = (char *)0x0;
  }
  free(p->pBins);
  free(p);
  return;
}

Assistant:

void Abc_NamStop( Abc_Nam_t * p )
{
//Abc_Print( 1, "Starting nam with %d bins.\n", p->nBins );
    Vec_StrErase( &p->vBuffer );
    Vec_IntErase( &p->vInt2Handle );
    Vec_IntErase( &p->vInt2Next );
    ABC_FREE( p->pStore );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}